

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int sort(lua_State *L)

{
  TValue *pTVar1;
  size_t sVar2;
  StkId pTVar3;
  StkId pTVar4;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  luaL_checkstack(L,0x28,"");
  pTVar1 = L->base + 1;
  if ((pTVar1 != &luaO_nilobject_ && pTVar1 < L->top) && (0 < L->base[1].tt)) {
    luaL_checktype(L,2,6);
  }
  pTVar4 = L->top;
  pTVar3 = L->base + 2;
  if (pTVar4 < pTVar3) {
    do {
      pTVar4->tt = 0;
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 < pTVar3);
    L->top = pTVar4;
  }
  L->top = pTVar3;
  auxsort(L,1,(int)sVar2);
  return 0;
}

Assistant:

static int sort(lua_State*L){
int n=aux_getn(L,1);
luaL_checkstack(L,40,"");
if(!lua_isnoneornil(L,2))
luaL_checktype(L,2,6);
lua_settop(L,2);
auxsort(L,1,n);
return 0;
}